

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O1

void list_store_send(t_list_store *x,t_symbol *s)

{
  undefined8 *puVar1;
  int argc;
  t_pd *pp_Var2;
  undefined8 uVar3;
  word wVar4;
  t_atom *argv;
  undefined8 *puVar5;
  t_symbol *ptVar6;
  long lVar7;
  t_atom *ptVar8;
  long lVar9;
  t_atom *ptVar10;
  undefined1 auStack_48 [16];
  t_alist y;
  
  ptVar10 = (t_atom *)auStack_48;
  if (s->s_thing != (_class **)0x0) {
    argc = (x->x_alist).l_n;
    lVar9 = (long)argc;
    if (argc < 100) {
      ptVar10 = (t_atom *)(auStack_48 + lVar9 * -0x10);
      argv = ptVar10;
    }
    else {
      argv = (t_atom *)getbytes(lVar9 << 4);
    }
    if ((x->x_alist).l_npointer == 0) {
      if (0 < argc) {
        lVar7 = 0;
        ptVar8 = argv;
        do {
          puVar5 = (undefined8 *)((long)&(((x->x_alist).l_vec)->l_a).a_type + lVar7);
          wVar4 = *(word *)(puVar5 + 1);
          *(undefined8 *)ptVar8 = *puVar5;
          ptVar8->a_w = wVar4;
          lVar7 = lVar7 + 0x28;
          ptVar8 = ptVar8 + 1;
        } while (lVar9 * 0x28 != lVar7);
      }
      pp_Var2 = s->s_thing;
      ptVar10[-1].a_w.w_symbol = (t_symbol *)0x184e4a;
      ptVar6 = gensym("list");
      ptVar10[-1].a_w.w_symbol = (t_symbol *)0x184e5a;
      pd_list(pp_Var2,ptVar6,argc,argv);
    }
    else {
      ptVar10[-1].a_w.w_symbol = (t_symbol *)0x184dbb;
      alist_clone(&x->x_alist,(t_alist *)(auStack_48 + 8),0,argc);
      if (0 < argc) {
        lVar7 = 0;
        puVar5 = (undefined8 *)y._8_8_;
        do {
          uVar3 = puVar5[1];
          puVar1 = (undefined8 *)((long)&argv->a_type + lVar7);
          *puVar1 = *puVar5;
          puVar1[1] = uVar3;
          lVar7 = lVar7 + 0x10;
          puVar5 = puVar5 + 5;
        } while (lVar9 << 4 != lVar7);
      }
      pp_Var2 = s->s_thing;
      ptVar10[-1].a_w.w_symbol = (t_symbol *)0x184df1;
      ptVar6 = gensym("list");
      ptVar10[-1].a_w.w_symbol = (t_symbol *)0x184e01;
      pd_list(pp_Var2,ptVar6,argc,argv);
      ptVar10[-1].a_w.w_symbol = (t_symbol *)0x184e0a;
      alist_clear((t_alist *)(auStack_48 + 8));
    }
    if (99 < argc) {
      ptVar10[-1].a_w.w_symbol = (t_symbol *)0x184e6e;
      freebytes(argv,lVar9 << 4);
    }
    return;
  }
  pd_error(x,"%s: no such object",s->s_name);
  return;
}

Assistant:

static void list_store_send(t_list_store *x, t_symbol *s)
{
    t_atom *vec;
    int n = x->x_alist.l_n;
    if (!s->s_thing)
    {
        pd_error(x, "%s: no such object", s->s_name);
        return;
    }
    ATOMS_ALLOCA(vec, n);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, 0, n);
        alist_toatoms(&y, vec, 0, n);
        pd_list(s->s_thing, gensym("list"), n, vec);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, vec, 0, n);
        pd_list(s->s_thing, gensym("list"), n, vec);
    }
    ATOMS_FREEA(vec, n);
}